

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O2

void __thiscall
tchecker::clockbounds::global_lu_map_t::resize(global_lu_map_t *this,clock_id_t clock_nb)

{
  map_t *pmVar1;
  
  clear(this);
  this->_clock_nb = clock_nb;
  pmVar1 = allocate_map((ulong)clock_nb);
  this->_L = pmVar1;
  pmVar1 = allocate_map((ulong)this->_clock_nb);
  this->_U = pmVar1;
  clockbounds::clear(this->_L);
  clockbounds::clear(this->_U);
  return;
}

Assistant:

void global_lu_map_t::resize(tchecker::clock_id_t clock_nb)
{
  clear();

  _clock_nb = clock_nb;
  _L = tchecker::clockbounds::allocate_map(_clock_nb);
  _U = tchecker::clockbounds::allocate_map(_clock_nb);
  tchecker::clockbounds::clear(*_L);
  tchecker::clockbounds::clear(*_U);
}